

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

Type __thiscall camp::Function::argType(Function *this,size_t index)

{
  pointer pTVar1;
  OutOfRange *__return_storage_ptr__;
  allocator local_aa;
  allocator local_a9;
  string local_a8;
  string local_88;
  OutOfRange local_68;
  
  pTVar1 = (this->m_argTypes).super__Vector_base<camp::Type,_std::allocator<camp::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (index < (ulong)((long)(this->m_argTypes).
                            super__Vector_base<camp::Type,_std::allocator<camp::Type>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pTVar1 >> 2)) {
    return pTVar1[index];
  }
  __return_storage_ptr__ = (OutOfRange *)__cxa_allocate_exception(0x48);
  OutOfRange::OutOfRange
            (&local_68,index,
             (long)(this->m_argTypes).super__Vector_base<camp::Type,_std::allocator<camp::Type>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_argTypes).super__Vector_base<camp::Type,_std::allocator<camp::Type>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2);
  std::__cxx11::string::string
            ((string *)&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/function.cpp"
             ,&local_a9);
  std::__cxx11::string::string
            ((string *)&local_a8,"Type camp::Function::argType(std::size_t) const",&local_aa);
  Error::prepare<camp::OutOfRange>(__return_storage_ptr__,&local_68,&local_88,0x42,&local_a8);
  __cxa_throw(__return_storage_ptr__,&OutOfRange::typeinfo,Error::~Error);
}

Assistant:

Type Function::argType(std::size_t index) const
{
    // Make sure that the index is not out of range
    if (index >= m_argTypes.size())
        CAMP_ERROR(OutOfRange(index, m_argTypes.size()));

    return m_argTypes[index];
}